

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlCtxtNewInputFromMemory
          (xmlParserCtxtPtr ctxt,char *url,void *mem,size_t size,char *encoding,
          xmlParserInputFlags flags)

{
  xmlParserInputPtr input;
  xmlParserInputFlags flags_local;
  char *encoding_local;
  size_t size_local;
  void *mem_local;
  char *url_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (mem == (void *)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)xmlNewInputFromMemory(url,mem,size,flags);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (encoding != (char *)0x0) {
      xmlSwitchInputEncodingName(ctxt,(xmlParserInputPtr)ctxt_local,encoding);
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromMemory(xmlParserCtxtPtr ctxt, const char *url,
                          const void *mem, size_t size,
                          const char *encoding, xmlParserInputFlags flags) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (mem == NULL))
	return(NULL);

    input = xmlNewInputFromMemory(url, mem, size, flags);
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}